

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_handle.cpp
# Opt level: O0

bool __thiscall miniros::NodeHandle::getParamCached(NodeHandle *this,string *key,float *f)

{
  byte bVar1;
  NodeHandle *in_RDX;
  NodeHandle *in_RDI;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  string *this_00;
  string local_48 [32];
  string local_28 [7];
  undefined1 in_stack_ffffffffffffffdf;
  string *in_stack_ffffffffffffffe0;
  
  this_00 = local_48 + 0x20;
  getMasterLink(in_RDI);
  std::__shared_ptr_access<miniros::MasterLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<miniros::MasterLink,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x47bc06);
  resolveName(in_RDX,in_stack_ffffffffffffffe0,(bool)in_stack_ffffffffffffffdf);
  bVar1 = MasterLink::getCached
                    ((MasterLink *)this_00,
                     (string *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
                     (float *)0x47bc3a);
  std::__cxx11::string::~string(local_48);
  std::shared_ptr<miniros::MasterLink>::~shared_ptr((shared_ptr<miniros::MasterLink> *)0x47bc54);
  return (bool)(bVar1 & 1);
}

Assistant:

bool NodeHandle::getParamCached(const std::string& key, float& f) const
{
  return getMasterLink()->getCached(resolveName(key), f);
}